

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O1

void __thiscall Steiner::plot(Steiner *this,string *plotName)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  pointer pPVar4;
  ostream *poVar5;
  pointer pEVar6;
  ulong uVar7;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  pointer pPVar12;
  long lVar13;
  long lVar14;
  pointer pPVar15;
  int iVar16;
  bool bVar17;
  string ofileName;
  ofstream of;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  pointer piVar8;
  
  local_250[0] = local_240;
  pcVar3 = (plotName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_250,pcVar3,pcVar3 + plotName->_M_string_length);
  std::ofstream::ofstream(&local_230,(string *)local_250,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set size ratio -1",0x11)
  ;
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set nokey",9);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set xrange[",0xb);
  poVar5 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryRight - this->_boundaryLeft) * -0.05);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  poVar5 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryRight - this->_boundaryLeft) * 1.05);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set yrange[",0xb);
  poVar5 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryTop - this->_boundaryBottom) * -0.05);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  poVar5 = std::ostream::_M_insert<double>
                     ((double)(this->_boundaryTop - this->_boundaryBottom) * 1.05);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set object ",0xb);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," rect from ",0xb);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->_boundaryLeft);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->_boundaryBottom);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->_boundaryRight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->_boundaryTop);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"fc rgb \"grey\" behind\n",0x15);
  if (0 < this->_init_p) {
    lVar13 = 0;
    lVar14 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"set object circle at first ",0x1b);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_230,
                          *(int *)((long)&((this->_points).
                                           super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                           .super__Vector_impl_data._M_start)->x + lVar13));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,*(int *)((long)&((this->_points).
                                                  super__Vector_base<Point,_std::allocator<Point>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->y +
                                         lVar13));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," radius char 0.3 fillstyle solid ",0x21);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"fc rgb \"red\" front\n",0x13);
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0x20;
    } while (lVar14 < this->_init_p);
  }
  pEVar6 = (this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
      super__Vector_impl_data._M_finish == pEVar6) {
    iVar16 = 2;
  }
  else {
    iVar16 = 2;
    uVar9 = 0;
    do {
      iVar1 = pEVar6[uVar9].p1;
      pPVar15 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar2 = pEVar6[uVar9].p2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," from ",6);
      pPVar12 = pPVar15 + iVar1;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar12->x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar12->y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
      pPVar15 = pPVar15 + iVar2;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar15->x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar15->y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," nohead lc rgb \"white\" lw 1 front\n",0x22);
      uVar9 = (ulong)(iVar16 - 1);
      pEVar6 = (this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pEVar6 >> 2) * -0x3333333333333333;
      iVar16 = iVar16 + 1;
    } while (uVar9 <= uVar10 && uVar10 - uVar9 != 0);
  }
  piVar8 = (this->_init_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_init_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar8) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      pPVar15 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar6 = (this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = pEVar6[piVar8[uVar9]].p1;
      iVar2 = pEVar6[piVar8[uVar9]].p2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," from ",6);
      pPVar12 = pPVar15 + iVar1;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar12->x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar12->y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
      pPVar15 = pPVar15 + iVar2;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar15->x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar15->y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," nohead lc rgb \"blue\" lw 1 front\n",0x21);
      piVar8 = (this->_init_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = iVar16 + 1;
      bVar17 = uVar10 < (ulong)((long)(this->_init_MST).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar8 >> 2);
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar17);
  }
  uVar11 = this->_init_p;
  uVar9 = (ulong)uVar11;
  if (uVar9 < (ulong)((long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5)) {
    do {
      uVar11 = uVar11 + 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"set object circle at first ",0x1b);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_230,
                          (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar9].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar9].y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," radius char 0.3 fillstyle solid ",0x21);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"fc rgb \"yellow\" front\n",0x16);
      uVar9 = (ulong)uVar11;
    } while (uVar9 < (ulong)((long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_points).super__Vector_base<Point,_std::allocator<Point>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  piVar8 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar8) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      uVar7 = (ulong)piVar8[uVar9];
      uVar9 = uVar7 + 0x3f;
      if (-1 < (long)uVar7) {
        uVar9 = uVar7;
      }
      if (((this->_edges_del).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) +
            (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar7 & 0x3f) & 1) == 0) {
        pPVar4 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar6 = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = pEVar6[uVar7].p1;
        pPVar15 = pPVar4 + iVar1;
        iVar2 = pEVar6[uVar7].p2;
        pPVar12 = pPVar4 + iVar2;
        if (pPVar4[iVar1].x != pPVar4[iVar2].x) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," from ",6);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar15->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar15->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar12->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar15->y);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," nohead lc rgb \"black\" lw 1.5 front\n",0x24);
          iVar16 = iVar16 + 1;
        }
        if (pPVar15->y != pPVar12->y) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," from ",6);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar12->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar15->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar12->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar12->y);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," nohead lc rgb \"black\" lw 1.5 front\n",0x24);
          iVar16 = iVar16 + 1;
        }
      }
      piVar8 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar17 = uVar10 < (ulong)((long)(this->_MST).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2)
      ;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar17);
  }
  if ((this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," from ",6);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar9].p1].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar9].p1].y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar9].p2].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar9].p1].y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," nohead lc rgb \"black\" lw 1.5 front\n",0x24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set arrow ",10);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar16 + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," from ",6);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar9].p2].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar9].p1].y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar9].p2].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(this->_points).super__Vector_base<Point,_std::allocator<Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar9].p2].y);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," nohead lc rgb \"black\" lw 1.5 front\n",0x24);
      uVar9 = ((long)(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
      iVar16 = iVar16 + 2;
      bVar17 = uVar10 <= uVar9;
      lVar13 = uVar9 - uVar10;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar17 && lVar13 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"plot 1000000000",0xf);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"pause -1 \'Press any key\'",0x18);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  return;
}

Assistant:

void Steiner::plot(const string& plotName) {
  string ofileName = plotName;
  ofstream of(ofileName, ofstream::out);
  of << "set size ratio -1" << endl;
  of << "set nokey" << endl;
  of << "set xrange["
     << (_boundaryRight - _boundaryLeft) * -0.05 << ":"
     << (_boundaryRight - _boundaryLeft) * 1.05 << "]" << endl;
  of << "set yrange["
     << (_boundaryTop - _boundaryBottom) * -0.05 << ":"
     << (_boundaryTop - _boundaryBottom) * 1.05 << "]" << endl;
  int idx = 1;
  of << "set object " << idx++ << " rect from "
     << _boundaryLeft << "," << _boundaryBottom << " to "
     << _boundaryRight << "," << _boundaryTop << "fc rgb \"grey\" behind\n";
  // point
  for (int i = 0; i < _init_p; ++i) {
    of << "set object circle at first " << _points[i].x << ","
       << _points[i].y << " radius char 0.3 fillstyle solid "
       << "fc rgb \"red\" front\n";
  }
  // RSG
  for (unsigned i = 0; i < _init_edges.size(); ++i) {
    Point& p1 = _points[_init_edges[i].p1];
    Point& p2 = _points[_init_edges[i].p2];
    of << "set arrow " << idx++ << " from "
       << p1.x << "," << p1.y << " to "
       << p2.x << "," << p2.y
       << " nohead lc rgb \"white\" lw 1 front\n";
  }
  // MST
  for (unsigned i = 0; i < _init_MST.size(); ++i) {
    Point& p1 = _points[_init_edges[_init_MST[i]].p1];
    Point& p2 = _points[_init_edges[_init_MST[i]].p2];
    of << "set arrow " << idx++ << " from "
       << p1.x << "," << p1.y << " to "
       << p2.x << "," << p2.y
       << " nohead lc rgb \"blue\" lw 1 front\n";
  }
  // s-point
  for (unsigned i = _init_p; i < _points.size(); ++i) {
    of << "set object circle at first " << _points[i].x << ","
       << _points[i].y << " radius char 0.3 fillstyle solid "
       << "fc rgb \"yellow\" front\n";
  }
  // RST
  for (unsigned i = 0; i < _MST.size(); ++i) {
    if (_edges_del[_MST[i]]) continue;
    Point& p1 = _points[_edges[_MST[i]].p1];
    Point& p2 = _points[_edges[_MST[i]].p2];
    if (p1.x != p2.x) {
      of << "set arrow " << idx++ << " from "
        << p1.x << "," << p1.y << " to "
        << p2.x << "," << p1.y
        << " nohead lc rgb \"black\" lw 1.5 front\n";
    }
    if (p1.y != p2.y) {
      of << "set arrow " << idx++ << " from "
        << p2.x << "," << p1.y << " to "
        << p2.x << "," << p2.y
        << " nohead lc rgb \"black\" lw 1.5 front\n";
    }
  }
  for (unsigned i = 0; i < _newE.size(); ++i) {
    of << "set arrow " << idx++ << " from "
       << _points[_newE[i].p1].x << "," << _points[_newE[i].p1].y << " to "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p1].y
       << " nohead lc rgb \"black\" lw 1.5 front\n";
    of << "set arrow " << idx++ << " from "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p1].y << " to "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p2].y
       << " nohead lc rgb \"black\" lw 1.5 front\n";
  }
  of << "plot 1000000000" << endl;
  of << "pause -1 'Press any key'" << endl;
  of.close();
}